

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectCast.h
# Opt level: O3

PDFBoolean * PDFObjectCast<PDFBoolean>(PDFObject *inOriginal)

{
  EPDFObjectType EVar1;
  
  if (inOriginal != (PDFObject *)0x0) {
    EVar1 = PDFObject::GetType(inOriginal);
    if (EVar1 == ePDFObjectBoolean) {
      return (PDFBoolean *)inOriginal;
    }
    RefCountObject::Release(&inOriginal->super_RefCountObject);
  }
  return (PDFBoolean *)0x0;
}

Assistant:

T* PDFObjectCast(PDFObject* inOriginal)
{
	if(!inOriginal)
		return NULL;

	if(inOriginal->GetType() == (PDFObject::EPDFObjectType)T::eType)
	{
		return (T*)inOriginal;
	}
	else
	{
		inOriginal->Release();
		return NULL;
	}
}